

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O2

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AbsConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
          *prepro)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  VarOrConst VVar6;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  allocator_type local_206;
  allocator_type local_205;
  int local_204;
  _Vector_base<int,_std::allocator<int>_> local_200;
  _Vector_base<double,_std::allocator<double>_> local_1e8;
  double local_1d0;
  LinTerms local_1c8;
  AffineExpr local_150;
  LinearFunctionalConstraint local_d0;
  
  iVar1 = (c->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>).
          args_._M_elems[0];
  lVar2 = (long)iVar1;
  dVar5 = *(double *)(*(long *)(this + 0x40) + lVar2 * 8);
  if (0.0 <= dVar5) {
    prepro->result_var_ = iVar1;
  }
  else {
    dVar4 = *(double *)(*(long *)(this + 0x58) + lVar2 * 8);
    if (dVar4 <= 0.0) {
      local_1d0 = -1.0;
      __l._M_len = 1;
      __l._M_array = &local_1d0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1e8,__l,&local_205);
      __l_00._M_len = 1;
      __l_00._M_array = &local_204;
      local_204 = iVar1;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_200,__l_00,&local_206);
      LinTerms::LinTerms(&local_1c8,(vector<double,_std::allocator<double>_> *)&local_1e8,
                         (vector<int,_std::allocator<int>_> *)&local_200);
      LinTerms::LinTerms(&local_150.super_LinTerms,&local_1c8);
      local_150.constant_term_ = 0.0;
      LinearFunctionalConstraint::LinearFunctionalConstraint(&local_d0,&local_150);
      VVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResult2Args<mp::LinearFunctionalConstraint>
                        ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)this,&local_d0);
      LinearFunctionalConstraint::~LinearFunctionalConstraint(&local_d0);
      LinTerms::~LinTerms(&local_150.super_LinTerms);
      LinTerms::~LinTerms(&local_1c8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_200);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1e8);
      prepro->result_var_ = VVar6.field_1._0_4_;
    }
    else {
      dVar5 = -dVar5;
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
      }
      uVar3 = -(ulong)(dVar4 < prepro->ub_);
      prepro->lb_ = (double)(~-(ulong)(prepro->lb_ < 0.0) & (ulong)prepro->lb_);
      prepro->ub_ = (double)(~uVar3 & (ulong)prepro->ub_ | (ulong)dVar4 & uVar3);
      prepro->type_ = *(Type *)(*(long *)(this + 0xa0) + lVar2 * 4);
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      AbsConstraint& c, PreprocessInfo& prepro) {
    const auto argvar = c.GetArguments()[0];
    const auto lb = MPD( lb(argvar) ),
        ub = MPD( ub(argvar) );
    if (lb>=0.0) {  // When result var is set, \a c is skipped
      prepro.set_result_var(argvar);
      return;
    } else if (ub<=0.0) {
      auto res = MPD( AssignResult2Args(   // create newvar = -argvar
            LinearFunctionalConstraint({ {{-1.0}, {argvar}}, 0.0 })) );
      prepro.set_result_var(res.get_var());
      return;
    }
    prepro.narrow_result_bounds(0.0, std::max(-lb, ub));
    prepro.set_result_type( MPD( var_type(argvar) ) );
  }